

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

TerminalSize duckdb::Terminal::TryMeasureTerminalSize(void)

{
  int __fd;
  ssize_t sVar1;
  size_t __n;
  bool bVar2;
  char seq [32];
  TerminalSize start;
  int ofd;
  TerminalSize result;
  char local_48 [36];
  TerminalSize local_24;
  TerminalSize local_1c;
  TerminalSize local_14;
  int local_c;
  TerminalSize local_8;
  
  local_c = 1;
  TerminalSize::TerminalSize(&local_14);
  TerminalSize::TerminalSize(&local_8);
  local_1c = GetCursorPosition();
  local_14.ws_col = local_1c.ws_col;
  if ((local_14.ws_col != 0) &&
     (local_14 = local_1c, sVar1 = ::write(local_c,"\x1b[999;999f",10), sVar1 == 10)) {
    local_24 = GetCursorPosition();
    local_8.ws_col = local_24.ws_col;
    bVar2 = local_8.ws_col != 0;
    local_8 = local_24;
    if (bVar2) {
      snprintf(local_48,0x20,"\x1b[%d;%df",(ulong)local_14 >> 0x20,(ulong)local_14 & 0xffffffff);
      __fd = local_c;
      __n = strlen(local_48);
      ::write(__fd,local_48,__n);
    }
  }
  return local_8;
}

Assistant:

TerminalSize Terminal::TryMeasureTerminalSize() {
	int ofd = STDOUT_FILENO;
	/* ioctl() failed. Try to query the terminal itself. */
	TerminalSize start, result;

	/* Get the initial position so we can restore it later. */
	start = GetCursorPosition();
	if (!start.ws_col) {
		return result;
	}

	/* Go to bottom-right margin */
	if (write(ofd, "\x1b[999;999f", 10) != 10) {
		return result;
	}
	result = GetCursorPosition();
	if (!result.ws_col) {
		return result;
	}

	/* Restore position. */
	char seq[32];
	snprintf(seq, 32, "\x1b[%d;%df", start.ws_row, start.ws_col);
	if (write(ofd, seq, strlen(seq)) == -1) {
		/* Can't recover... */
	}
	return result;
}